

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O2

void ycc_rgb_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                    JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  jpeg_color_deconverter *pjVar4;
  JSAMPLE *pJVar5;
  _func_void_j_decompress_ptr *p_Var6;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var7;
  _func_void_j_decompress_ptr *p_Var8;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var9;
  JSAMPROW pJVar10;
  JSAMPROW pJVar11;
  JSAMPROW pJVar12;
  ulong uVar13;
  ulong uVar14;
  JSAMPROW pJVar15;
  
  pjVar4 = cinfo->cconvert;
  uVar3 = cinfo->output_width;
  pJVar5 = cinfo->sample_range_limit;
  p_Var6 = pjVar4[1].start_pass;
  p_Var7 = pjVar4[1].color_convert;
  p_Var8 = pjVar4[2].start_pass;
  p_Var9 = pjVar4[2].color_convert;
  while (0 < num_rows) {
    num_rows = num_rows + -1;
    pJVar10 = (*input_buf)[input_row];
    pJVar11 = input_buf[1][input_row];
    pJVar12 = input_buf[2][input_row];
    input_row = input_row + 1;
    pJVar15 = *output_buf;
    for (uVar13 = 0; uVar3 != uVar13; uVar13 = uVar13 + 1) {
      uVar14 = (ulong)pJVar10[uVar13];
      bVar1 = pJVar11[uVar13];
      bVar2 = pJVar12[uVar13];
      *pJVar15 = pJVar5[(long)*(int *)(p_Var6 + (ulong)bVar2 * 4) + uVar14];
      pJVar15[1] = pJVar5[(long)(int)((ulong)(*(long *)(p_Var8 + (ulong)bVar2 * 8) +
                                             *(long *)(p_Var9 + (ulong)bVar1 * 8)) >> 0x10) + uVar14
                         ];
      pJVar15[2] = pJVar5[(long)*(int *)(p_Var7 + (ulong)bVar1 * 4) + uVar14];
      pJVar15 = pJVar15 + 3;
    }
    output_buf = output_buf + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
ycc_rgb_convert (j_decompress_ptr cinfo,
		 JSAMPIMAGE input_buf, JDIMENSION input_row,
		 JSAMPARRAY output_buf, int num_rows)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr) cinfo->cconvert;
  register int y, cb, cr;
  register JSAMPROW outptr;
  register JSAMPROW inptr0, inptr1, inptr2;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->output_width;
  /* copy these pointers into registers if possible */
  register JSAMPLE * range_limit = cinfo->sample_range_limit;
  register int * Crrtab = cconvert->Cr_r_tab;
  register int * Cbbtab = cconvert->Cb_b_tab;
  register INT32 * Crgtab = cconvert->Cr_g_tab;
  register INT32 * Cbgtab = cconvert->Cb_g_tab;
  SHIFT_TEMPS

  while (--num_rows >= 0) {
    inptr0 = input_buf[0][input_row];
    inptr1 = input_buf[1][input_row];
    inptr2 = input_buf[2][input_row];
    input_row++;
    outptr = *output_buf++;
    for (col = 0; col < num_cols; col++) {
      y  = GETJSAMPLE(inptr0[col]);
      cb = GETJSAMPLE(inptr1[col]);
      cr = GETJSAMPLE(inptr2[col]);
      /* Range-limiting is essential due to noise introduced by DCT losses. */
      outptr[RGB_RED] =   range_limit[y + Crrtab[cr]];
      outptr[RGB_GREEN] = range_limit[y +
			      ((int) RIGHT_SHIFT(Cbgtab[cb] + Crgtab[cr],
						 SCALEBITS))];
      outptr[RGB_BLUE] =  range_limit[y + Cbbtab[cb]];
      outptr += RGB_PIXELSIZE;
    }
  }
}